

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int arena_i_retain_grow_limit_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  size_t *new_limit_00;
  size_t __n;
  size_t new_limit;
  size_t local_40;
  size_t local_38;
  
  if (!opt_retain) {
    return 2;
  }
  iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  if (iVar3 != 0) {
    malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  uVar1 = mib[1];
  iVar3 = 0xe;
  if (((uVar1 >> 0x20 == 0) && (uVar4 = narenas_total_get(), (uint)uVar1 < uVar4)) &&
     ((arena_t *)arenas[uVar1].repr != (arena_t *)0x0)) {
    if (newp == (void *)0x0) {
      new_limit_00 = (size_t *)0x0;
    }
    else {
      iVar3 = 0x16;
      if (newlen != 8) goto LAB_0011ea48;
      local_38 = *newp;
      new_limit_00 = &local_38;
    }
    _Var2 = arena_retain_grow_limit_get_set
                      (tsd,(arena_t *)arenas[uVar1].repr,&local_40,new_limit_00);
    iVar3 = 0xe;
    if (!_Var2) {
      iVar3 = 0;
      if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
        uVar1 = *oldlenp;
        if (uVar1 == 8) {
          *(size_t *)oldp = local_40;
          iVar3 = 0;
        }
        else {
          __n = 8;
          if (uVar1 < 8) {
            __n = uVar1;
          }
          memcpy(oldp,&local_40,__n);
          iVar3 = 0x16;
        }
      }
    }
  }
LAB_0011ea48:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  return iVar3;
}

Assistant:

static int
arena_i_retain_grow_limit_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	unsigned arena_ind;
	arena_t *arena;

	if (!opt_retain) {
		/* Only relevant when retain is enabled. */
		return ENOENT;
	}

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	MIB_UNSIGNED(arena_ind, 1);
	if (arena_ind < narenas_total_get() && (arena =
	    arena_get(tsd_tsdn(tsd), arena_ind, false)) != NULL) {
		size_t old_limit, new_limit;
		if (newp != NULL) {
			WRITE(new_limit, size_t);
		}
		bool err = arena_retain_grow_limit_get_set(tsd, arena,
		    &old_limit, newp != NULL ? &new_limit : NULL);
		if (!err) {
			READ(old_limit, size_t);
			ret = 0;
		} else {
			ret = EFAULT;
		}
	} else {
		ret = EFAULT;
	}
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}